

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::doListAttachments(QPDFJob *this,QPDF *pdf)

{
  string *key;
  bool bVar1;
  Pipeline *pPVar2;
  _Rb_tree_node_base *p_Var3;
  shared_ptr<QPDFFileSpecObjectHelper> efoh;
  QPDFEmbeddedFileDocumentHelper efdh;
  string *local_118;
  _Base_ptr local_110;
  _Any_data local_108;
  code *local_f8;
  code *pcStack_f0;
  long *local_e8 [2];
  long local_d8 [2];
  QPDFObjGen local_c8;
  QPDFLogger local_c0;
  string local_b0;
  undefined1 local_90 [24];
  element_type *local_78 [2];
  _Rb_tree_node_base *local_68;
  QPDFEmbeddedFileDocumentHelper local_50;
  
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper(&local_50,pdf);
  bVar1 = QPDFEmbeddedFileDocumentHelper::hasEmbeddedFiles(&local_50);
  if (bVar1) {
    QPDFEmbeddedFileDocumentHelper::getEmbeddedFiles_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
                *)(local_90 + 0x10),&local_50);
    if (local_68 != (_Rb_tree_node_base *)local_78) {
      p_Var3 = local_68;
      do {
        local_118 = *(string **)(p_Var3 + 2);
        local_110 = p_Var3[2]._M_parent;
        if (local_110 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&local_110->_M_parent = *(int *)&local_110->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&local_110->_M_parent = *(int *)&local_110->_M_parent + 1;
          }
        }
        QPDFLogger::getInfo(&local_c0,
                            SUB81((((this->m).
                                    super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->log).
                                  super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                  0));
        pPVar2 = Pipeline::operator<<
                           ((Pipeline *)
                            local_c0.m.
                            super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,(string *)(p_Var3 + 1));
        pPVar2 = Pipeline::operator<<(pPVar2," -> ");
        key = local_118;
        local_e8[0] = local_d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"");
        QPDFFileSpecObjectHelper::getEmbeddedFileStream((QPDFFileSpecObjectHelper *)local_90,key);
        local_c8 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_90);
        QPDFObjGen::unparse_abi_cxx11_(&local_b0,&local_c8,',');
        pPVar2 = Pipeline::operator<<(pPVar2,&local_b0);
        Pipeline::operator<<(pPVar2,"\n");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((element_type *)local_90._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
        }
        if (local_e8[0] != local_d8) {
          operator_delete(local_e8[0],local_d8[0] + 1);
        }
        if (local_c0.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c0.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_108._8_8_ = 0;
        local_108._M_unused._M_object = &local_118;
        pcStack_f0 = std::
                     _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:920:25)>
                     ::_M_invoke;
        local_f8 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:920:25)>
                   ::_M_manager;
        doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_108);
        if (local_f8 != (code *)0x0) {
          (*local_f8)(&local_108,&local_108,__destroy_functor);
        }
        if (local_110 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110);
        }
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      } while (p_Var3 != (_Rb_tree_node_base *)local_78);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
                 *)(local_90 + 0x10));
  }
  else {
    QPDFLogger::getInfo((QPDFLogger *)(local_90 + 0x10),
                        SUB81((((this->m).
                                super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->log).
                              super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
    pPVar2 = Pipeline::operator<<
                       ((Pipeline *)local_90._16_8_,
                        (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    Pipeline::operator<<(pPVar2," has no embedded files\n");
    if (local_78[0] != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78[0]);
    }
  }
  QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper(&local_50);
  return;
}

Assistant:

void
QPDFJob::doListAttachments(QPDF& pdf)
{
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    if (efdh.hasEmbeddedFiles()) {
        for (auto const& i: efdh.getEmbeddedFiles()) {
            std::string const& key = i.first;
            auto efoh = i.second;
            *m->log->getInfo() << key << " -> "
                               << efoh->getEmbeddedFileStream().getObjGen().unparse(',') << "\n";
            doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                auto desc = efoh->getDescription();
                if (!desc.empty()) {
                    v << "  description: " << desc << "\n";
                }
                v << "  preferred name: " << efoh->getFilename() << "\n";
                v << "  all names:\n";
                for (auto const& i2: efoh->getFilenames()) {
                    v << "    " << i2.first << " -> " << i2.second << "\n";
                }
                v << "  all data streams:\n";
                for (auto const& [key2, value2]: efoh->getEmbeddedFileStreams().as_dictionary()) {
                    if (value2.null()) {
                        continue;
                    }
                    auto efs = QPDFEFStreamObjectHelper(value2);
                    v << "    " << key2 << " -> " << efs.getObjectHandle().getObjGen().unparse(',')
                      << "\n";
                    v << "      creation date: " << efs.getCreationDate() << "\n"
                      << "      modification date: " << efs.getModDate() << "\n"
                      << "      mime type: " << efs.getSubtype() << "\n"
                      << "      checksum: " << QUtil::hex_encode(efs.getChecksum()) << "\n";
                }
            });
        }
    } else {
        *m->log->getInfo() << m->infilename.get() << " has no embedded files\n";
    }
}